

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::add_hlsl_resource_binding
          (CompilerHLSL *this,HLSLResourceBinding *binding)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Binding BVar3;
  Binding BVar4;
  ExecutionModel EVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  mapped_type *pmVar9;
  uint32_t local_2c;
  uint32_t uStack_28;
  key_type local_10;
  
  local_10.model = binding->stage;
  local_10.desc_set = binding->desc_set;
  local_10.binding = binding->binding;
  EVar5 = binding->stage;
  uVar6 = binding->desc_set;
  uVar7 = binding->binding;
  uVar8 = (binding->cbv).register_space;
  uVar1 = *(undefined8 *)&(binding->cbv).register_binding;
  uVar2 = *(undefined8 *)&(binding->uav).register_binding;
  BVar3 = binding->sampler;
  uStack_28 = (binding->srv).register_binding;
  local_2c = (uint32_t)((ulong)uVar2 >> 0x20);
  pmVar9 = ::std::__detail::
           _Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->resource_bindings,&local_10);
  (pmVar9->first).stage = EVar5;
  (pmVar9->first).desc_set = uVar6;
  (pmVar9->first).binding = uVar7;
  (pmVar9->first).cbv.register_space = uVar8;
  *(undefined8 *)&(pmVar9->first).cbv.register_binding = uVar1;
  *(undefined8 *)&(pmVar9->first).uav.register_binding = uVar2;
  BVar4.register_binding = uStack_28;
  BVar4.register_space = local_2c;
  (pmVar9->first).srv = BVar4;
  (pmVar9->first).sampler = BVar3;
  pmVar9->second = false;
  return;
}

Assistant:

void CompilerHLSL::add_hlsl_resource_binding(const HLSLResourceBinding &binding)
{
	StageSetBinding tuple = { binding.stage, binding.desc_set, binding.binding };
	resource_bindings[tuple] = { binding, false };
}